

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

iterator __thiscall
llvm::SmallVectorImpl<char_const*>::insert<char_const**,void>
          (SmallVectorImpl<char_const*> *this,iterator I,char **From,char **To)

{
  move_iterator<const_char_**> in_end;
  ulong uVar1;
  size_t sVar2;
  size_t __n;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  iterator ppcVar6;
  bool bVar7;
  
  ppcVar6 = *(iterator *)this;
  lVar5 = (long)I - (long)ppcVar6;
  if (ppcVar6 + *(uint *)(this + 8) == I) {
    append<char_const**,void>(this,From,To);
    ppcVar6 = (iterator)(lVar5 + *(long *)this);
  }
  else {
    if (I < ppcVar6) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x259,
                    "iterator llvm::SmallVectorImpl<const char *>::insert(iterator, ItTy, ItTy) [T = const char *, ItTy = const char **]"
                   );
    }
    if (ppcVar6 + *(uint *)(this + 8) < I) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x25a,
                    "iterator llvm::SmallVectorImpl<const char *>::insert(iterator, ItTy, ItTy) [T = const char *, ItTy = const char **]"
                   );
    }
    __n = (long)To - (long)From;
    uVar3 = (long)__n >> 3;
    SmallVectorImpl<const_char_*>::reserve
              ((SmallVectorImpl<const_char_*> *)this,*(uint *)(this + 8) + uVar3);
    uVar1 = (ulong)*(uint *)(this + 8);
    in_end._M_current = (char **)(*(long *)this + uVar1 * 8);
    ppcVar6 = (iterator)(*(long *)this + lVar5);
    sVar2 = uVar1 * 8 - lVar5;
    uVar4 = (long)sVar2 >> 3;
    if (uVar4 < uVar3) {
      SmallVectorBase::set_size((SmallVectorBase *)this,uVar3 + uVar1);
      if (uVar1 * 8 != lVar5) {
        memcpy((void *)((ulong)*(uint *)(this + 8) * 8 + *(long *)this + uVar4 * -8),ppcVar6,sVar2);
      }
      lVar5 = 0;
      while (bVar7 = uVar4 != 0, uVar4 = uVar4 - 1, bVar7) {
        *(undefined8 *)((long)ppcVar6 + lVar5) = *(undefined8 *)((long)From + lVar5);
        lVar5 = lVar5 + 8;
      }
      if ((char **)((long)From + lVar5) != To) {
        memcpy(in_end._M_current,(char **)((long)From + lVar5),__n - lVar5);
      }
    }
    else {
      append<std::move_iterator<char_const**>,void>
                (this,(move_iterator<const_char_**>)(in_end._M_current + -uVar3),in_end);
      sVar2 = (long)(in_end._M_current + -uVar3) - (long)ppcVar6;
      if (sVar2 != 0) {
        memmove((void *)((long)in_end._M_current - sVar2),ppcVar6,sVar2);
      }
      if (To != From) {
        ppcVar6 = (iterator)memmove(ppcVar6,From,__n);
        return ppcVar6;
      }
    }
  }
  return ppcVar6;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->set_size(this->size() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }